

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionloader.cpp
# Opt level: O0

void __thiscall
stackjit::FunctionLoader::generateDefinition
          (FunctionLoader *this,Function *function,FunctionDefinition *definition)

{
  VMState *pVVar1;
  AccessModifier accessModifier_00;
  pointer classType_00;
  undefined8 returnType_00;
  bool bVar2;
  Type *pTVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar4;
  runtime_error *this_01;
  AttributeContainer *pAVar5;
  pointer local_2d0;
  undefined1 local_278 [56];
  undefined1 local_240 [191];
  undefined1 local_181;
  undefined1 local_180 [96];
  undefined1 local_120 [78];
  bool isVirtual;
  AccessModifier accessModifier;
  ClassType *classType;
  Type *local_b0;
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> parameters;
  undefined1 local_48 [40];
  Type *returnType;
  FunctionDefinition *definition_local;
  Function *function_local;
  FunctionLoader *this_local;
  
  pVVar1 = this->mVMState;
  returnType = (Type *)definition;
  definition_local = (FunctionDefinition *)function;
  function_local = (Function *)this;
  Loader::Function::returnType_abi_cxx11_((Function *)local_48);
  pTVar3 = LoaderHelpers::getType(pVVar1,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  local_48._32_8_ = pTVar3;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&__range1);
  this_00 = Loader::Function::parameters_abi_cxx11_((Function *)definition_local);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_88), bVar2) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_a8,(string *)pbVar4);
    pVVar1 = this->mVMState;
    std::__cxx11::string::string((string *)&classType,local_a8);
    local_b0 = LoaderHelpers::getType(pVVar1,(string *)&classType);
    std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::push_back
              ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&__range1,
               &local_b0);
    std::__cxx11::string::~string((string *)&classType);
    std::__cxx11::string::~string(local_a8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  stack0xffffffffffffff28 = (pointer)0x0;
  local_120[0x47] = Public;
  local_120[0x46] = 0;
  bVar2 = Loader::Function::isMemberFunction((Function *)definition_local);
  if (bVar2) {
    pVVar1 = this->mVMState;
    Loader::Function::className_abi_cxx11_((Function *)local_120);
    std::operator+(local_120 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Ref.");
    pTVar3 = LoaderHelpers::getType(pVVar1,(string *)(local_120 + 0x20));
    if (pTVar3 == (Type *)0x0) {
      local_2d0 = (pointer)0x0;
    }
    else {
      local_2d0 = (pointer)__dynamic_cast(pTVar3,&Type::typeinfo,&ClassType::typeinfo,0);
    }
    stack0xffffffffffffff28 = local_2d0;
    std::__cxx11::string::~string((string *)(local_120 + 0x20));
    std::__cxx11::string::~string((string *)local_120);
    if (stack0xffffffffffffff28 == (pointer)0x0) {
      local_181 = 1;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      Loader::Function::className_abi_cxx11_((Function *)local_180);
      std::operator+(local_180 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x25ef66);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_180 + 0x40),local_180 + 0x20);
      std::runtime_error::runtime_error(this_01,(string *)(local_180 + 0x40));
      local_181 = 0;
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pAVar5 = Loader::Function::attributes_abi_cxx11_((Function *)definition_local);
    local_120[0x47] = LoaderHelpers::getAccessModifier(pAVar5);
    pAVar5 = Loader::Function::attributes_abi_cxx11_((Function *)definition_local);
    local_120[0x46] = LoaderHelpers::getIsVirtual(pAVar5);
  }
  bVar2 = Loader::Function::isMemberFunction((Function *)definition_local);
  if (bVar2) {
    Loader::Function::memberFunctionName_abi_cxx11_((Function *)local_240);
  }
  else {
    Loader::Function::name_abi_cxx11_((Function *)local_240);
  }
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)
             (local_278 + 0x20),
             (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&__range1);
  returnType_00 = local_48._32_8_;
  classType_00 = stack0xffffffffffffff28;
  accessModifier_00 = local_120[0x47];
  Loader::Function::memberFunctionName_abi_cxx11_((Function *)local_278);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_278,".constructor");
  FunctionDefinition::FunctionDefinition
            ((FunctionDefinition *)(local_240 + 0x20),(string *)local_240,
             (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)
             (local_278 + 0x20),(Type *)returnType_00,(ClassType *)classType_00,accessModifier_00,
             bVar2,(bool)(local_120[0x46] & 1));
  FunctionDefinition::operator=
            ((FunctionDefinition *)returnType,(FunctionDefinition *)(local_240 + 0x20));
  FunctionDefinition::~FunctionDefinition((FunctionDefinition *)(local_240 + 0x20));
  std::__cxx11::string::~string((string *)local_278);
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::~vector
            ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)
             (local_278 + 0x20));
  std::__cxx11::string::~string((string *)local_240);
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::~vector
            ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&__range1);
  return;
}

Assistant:

void FunctionLoader::generateDefinition(const Loader::Function& function, FunctionDefinition& definition) {
		auto returnType = LoaderHelpers::getType(mVMState, function.returnType());

		std::vector<const Type*> parameters;
		for (auto param : function.parameters()) {
			parameters.push_back(LoaderHelpers::getType(mVMState, param));
		}

		const ClassType* classType = nullptr;
		AccessModifier accessModifier = DEFAULT_ACCESS_MODIFIER;
		bool isVirtual = false;

		if (function.isMemberFunction()) {
			classType = dynamic_cast<const ClassType*>(LoaderHelpers::getType(mVMState, "Ref." + function.className()));
			if (classType == nullptr) {
				throw std::runtime_error("'" + function.className() + "' is not a class type.");
			}

			accessModifier = LoaderHelpers::getAccessModifier(function.attributes());
			isVirtual = LoaderHelpers::getIsVirtual(function.attributes());
		}

		definition = FunctionDefinition(
			function.isMemberFunction() ? function.memberFunctionName() : function.name(),
			parameters,
			returnType,
			classType,
			accessModifier,
			function.memberFunctionName() == ".constructor",
			isVirtual);
	}